

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::rotate
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          Dir dir)

{
  LinkType LVar1;
  LinkType LVar2;
  Dir in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  LinkType pX;
  LinkType yDir;
  LinkType y;
  Dir in_stack_ffffffffffffffc8;
  LinkType in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  
  uVar3 = in_ESI;
  opposite(in_EDX);
  LVar1 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                   in_stack_ffffffffffffffc8);
  LVar2 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                   in_stack_ffffffffffffffc8);
  opposite(in_EDX);
  setChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
           CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
           in_stack_ffffffffffffffc8,0);
  if (LVar2 != -1) {
    setParent((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
              CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
              in_stack_ffffffffffffffc8);
  }
  LVar2 = getParent((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                    CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  setParent((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
            CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
            in_stack_ffffffffffffffc8);
  if (LVar2 == -1) {
    *(LinkType *)*in_RDI = LVar1;
    LVar2 = in_stack_ffffffffffffffcc;
    in_ESI = in_stack_ffffffffffffffd0;
  }
  else {
    getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
             CONCAT44(uVar3,in_ESI),LVar2,in_stack_ffffffffffffffc8);
    setChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
             CONCAT44(uVar3,in_ESI),LVar2,in_stack_ffffffffffffffc8,0);
  }
  setChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
           CONCAT44(uVar3,in_ESI),LVar2,in_stack_ffffffffffffffc8,0);
  setParent((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
            CONCAT44(uVar3,in_ESI),LVar2,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void rotate(LinkType x, Dir dir) {
    LinkType y = getChild(x, opposite(dir));
    LinkType yDir = getChild(y, dir);
    setChild(x, opposite(dir), yDir);
    if (yDir != kNoLink) setParent(yDir, x);

    LinkType pX = getParent(x);
    setParent(y, pX);

    if (pX == kNoLink)
      rootNode = y;
    else
      setChild(pX, Dir((x != getChild(pX, dir)) ^ dir), y);

    setChild(y, dir, x);
    setParent(x, y);
  }